

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
nodesTest_methodTesting_Test::~nodesTest_methodTesting_Test(nodesTest_methodTesting_Test *this)

{
  nodesTest_methodTesting_Test *this_local;
  
  ~nodesTest_methodTesting_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(nodesTest, methodTesting) {
  nodes node1;

  ASSERT_EQ(node1.x_, 0);

  nodes node2(1, 1, 0, 0);
  ASSERT_EQ(node2.f_cost_, 0);

  int i = 0;
  ASSERT_EQ(node2.compute_g(i), 1);

  ASSERT_DOUBLE_EQ(node2.compute_h(1, 1), 0.0);

  ASSERT_DOUBLE_EQ(node2.compute_f(1, 1), 1.0);
}